

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_input.cpp
# Opt level: O1

void UseX_Flush_Extra_Move_Events(XEvent *event_return)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  XEvent next_event_return;
  int local_e0 [48];
  
  iVar4 = 0;
  if (event_return->type == 6) {
    iVar1 = XPending(Main_Display);
    iVar3 = 0;
    iVar4 = 0;
    if (iVar1 != 0) {
      do {
        XNextEvent(Main_Display,local_e0);
        if (local_e0[0] != 6) {
          XPutBackEvent(Main_Display,local_e0);
          iVar4 = iVar3;
          break;
        }
        memcpy(event_return,local_e0,0xc0);
        iVar3 = iVar3 + 1;
        iVar1 = XPending(Main_Display);
        iVar4 = iVar3;
      } while (iVar1 != 0);
    }
  }
  if (iVar4 != 0 && Am_Debug_Print_Input_Events != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"<> Ignoring ",0xc);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," move events\n",0xd);
    std::ostream::flush();
  }
  return;
}

Assistant:

void
UseX_Flush_Extra_Move_Events(XEvent &event_return)
{
  int cnt = 0;
  if (event_return.xany.type == MotionNotify) {
    XEvent next_event_return;
    while (XPending(Main_Display)) {
      XNextEvent(Main_Display, &next_event_return);
      if (next_event_return.xany.type == MotionNotify) {
        event_return = next_event_return;
        cnt++;
      } else {
        XPutBackEvent(Main_Display, &next_event_return);
        break;
      }
    }
  }
  if (Am_Debug_Print_Input_Events && cnt > 0)
    std::cout << "<> Ignoring " << cnt << " move events\n" << std::flush;
}